

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_file.c
# Opt level: O3

int write_FFSfile_attrs(FFSFile f,FMFormat_conflict format,void *data,attr_list attrs)

{
  FFSEncodeVector pFVar1;
  int iVar2;
  int iVar3;
  char *attr_list;
  FFSEncodeVector pFVar4;
  uint *puVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  FFSEncodeVector pFVar9;
  iovec *piVar10;
  int attr_len;
  int id_len;
  int indicator [2];
  int local_50;
  int local_4c;
  long local_48;
  char *local_40;
  uint local_38;
  uint local_34;
  
  iVar2 = format->format_index;
  local_4c = 0;
  local_40 = get_server_ID_FMformat(format,&local_4c);
  local_50 = 0;
  if (attrs == (attr_list)0x0) {
    local_50 = 0;
    attr_list = (char *)0x0;
    local_48 = 0;
  }
  else {
    local_48 = create_AttrBuffer();
    attr_list = (char *)encode_attr_for_xmit(attrs,local_48,&local_50);
  }
  iVar3 = 0;
  if (f->file_org == Indexed) {
    iVar3 = local_50;
  }
  local_50 = iVar3;
  init_format_info(f,iVar2);
  if ((f->info[iVar2].written_to_file == 0) && (iVar2 = write_format_to_file(f,format), iVar2 == 0))
  {
    iVar2 = 0;
  }
  else {
    output_data_index(f,local_40,local_4c,attr_list,local_50);
    pFVar4 = FFSencode_vector(f->buf,format,data);
    if (pFVar4->iov_base == (void *)0x0) {
      lVar6 = 0;
      iVar2 = 0;
    }
    else {
      iVar2 = 0;
      lVar6 = 0;
      pFVar1 = pFVar4;
      do {
        pFVar9 = pFVar1 + 1;
        iVar2 = iVar2 + 1;
        lVar6 = lVar6 + pFVar1->iov_len;
        pFVar1 = pFVar9;
      } while (pFVar9->iov_base != (void *)0x0);
    }
    iVar3 = (int)((ulong)lVar6 >> 0x20);
    uVar8 = iVar3 + 0x3000000;
    local_38 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | iVar3 << 0x18;
    uVar8 = (uint)lVar6;
    local_34 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
    piVar10 = (iovec *)(pFVar4 + -1);
    iVar7 = iVar2 + 1;
    pFVar4[-1].iov_len = 8;
    pFVar4[-1].iov_base = &local_38;
    iVar3 = f->max_iov;
    if (iVar3 <= iVar2) {
      do {
        iVar3 = (*f->writev_func)(f->file_id,piVar10,iVar3,(int *)0x0,(char **)0x0);
        if (iVar3 != f->max_iov) {
          puVar5 = (uint *)__errno_location();
          uVar8 = *puVar5;
          goto LAB_001174cd;
        }
        iVar7 = iVar7 - iVar3;
        piVar10 = piVar10 + iVar3;
      } while (iVar3 < iVar7);
    }
    iVar2 = (*f->writev_func)(f->file_id,piVar10,iVar7,(int *)0x0,(char **)0x0);
    if (iVar2 == iVar7) {
      if (local_48 != 0) {
        free_AttrBuffer();
      }
      f->data_count = f->data_count + 1;
      iVar2 = 1;
      iVar3 = (*ffs_file_lseek_func)(f->file_id,0,1);
      f->fpos = (long)iVar3;
    }
    else {
      puVar5 = (uint *)__errno_location();
      uVar8 = *puVar5;
LAB_001174cd:
      iVar2 = 0;
      printf("Write failed, errno %d\n",(ulong)uVar8);
    }
  }
  return iVar2;
}

Assistant:

extern int
write_FFSfile_attrs(FFSFile f, FMFormat format, void *data, attr_list attrs)
{
    DATA_LEN_TYPE byte_size;
    int index = format->format_index;
    int vec_count;
    FFSEncodeVector vec;
    int indicator[2];
    int id_len = 0;
    char *id = get_server_ID_FMformat(format, &id_len);
    int attr_len = 0;
    char *attr_block = NULL;
    AttrBuffer b = NULL;

    if (attrs) {
	b = create_AttrBuffer();
	attr_block = encode_attr_for_xmit(attrs, b, &attr_len);
    }

    attr_len = (f->file_org == Indexed)?attr_len:0;

    init_format_info(f, index);
    if (!f->info[index].written_to_file) {
	if (write_format_to_file(f, format) != 1) return 0;
    }

    output_data_index(f, id, id_len, attr_block, attr_len);
    //build_reverse_index(f, attr_list, attr_len);
    // Above ... deepak u need to replace attr_list with attr_block
    vec = FFSencode_vector(f->buf, format, data);
    vec_count = 0;
    byte_size = 0;
    while (vec[vec_count].iov_base != NULL) {
	byte_size += vec[vec_count].iov_len;
	vec_count++;
    }

    /*
     * next_data indicator is two 4-byte chunks in network byte order.
     * The top byte is 0x3.  The next byte is reserved for future use.
     * The following 6-bytes are the size of the data -- assume size fits
     * in a signed int.
     */
    indicator[0] = htonl((0x3 << 24) + (byte_size >> 32));
    indicator[1] = htonl(byte_size & 0xffffffff); 

    /* 
     *  utilize the fact that we have some blank vec entries *before the 
     *  beginning* of the vec we are given.  see ffs.c 
     */
    vec--;
    vec_count++;
    vec[0].iov_len = 8;
    vec[0].iov_base = indicator;
    while (vec_count > f->max_iov) {
	/* 
	 * if iovcnt is more than the number of chunks we can write in a 
	 * single AtomicWriteV, loop to write out max allowed.
	 */
	if (f->writev_func(f->file_id, (struct iovec *)vec, f->max_iov, 
			   NULL, NULL) != f->max_iov) {
	    printf("Write failed, errno %d\n", errno);
	    return 0;
	}
	vec_count -= f->max_iov;
	vec += f->max_iov;
    }
    if (f->writev_func(f->file_id, (struct iovec *)vec, vec_count, 
		       NULL, NULL) != vec_count) {
	printf("Write failed, errno %d\n", errno);
	return 0;
    }
    if (b) free_AttrBuffer(b);

    f->data_count++;
    update_fpos(f);
    return 1;
}